

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

Matrix<double,_3,_3> *
gl4cts::Math::inverse<3>(Matrix<double,_3,_3> *__return_storage_ptr__,Matrix<double,_3,_3> *matrix)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double *pdVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  GLuint c;
  long lVar9;
  ulong uVar10;
  int row;
  long lVar11;
  double *pdVar12;
  GLuint r;
  long lVar13;
  ulong uVar14;
  Vector<double,_3> *pVVar15;
  GLuint c_1;
  ulong uVar16;
  GLuint r_1;
  ulong uVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  bool bVar22;
  undefined8 uVar23;
  Matrix<double,_3,_3> adjugate;
  Matrix<double,_3,_3> cof;
  double adStack_d0 [3];
  undefined1 local_b8 [48];
  undefined1 local_88 [16];
  double local_78;
  double local_68 [9];
  long lVar21;
  
  puVar7 = local_b8;
  puVar8 = local_b8;
  pdVar6 = local_68;
  local_68[6] = 0.0;
  local_68[7] = 0.0;
  local_68[4] = 0.0;
  local_68[5] = 0.0;
  local_68[2] = 0.0;
  local_68[3] = 0.0;
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  local_68[8] = 0.0;
  lVar9 = 0;
  lVar11 = 0;
  do {
    lVar13 = 0;
    auVar19 = _DAT_019fcc00;
    do {
      bVar22 = SUB164(auVar19 ^ _DAT_019f5ce0,4) == -0x80000000 &&
               SUB164(auVar19 ^ _DAT_019f5ce0,0) < -0x7ffffffd;
      if (bVar22) {
        uVar23 = 0x3ff0000000000000;
        if (lVar9 != lVar13) {
          uVar23 = 0;
        }
        *(undefined8 *)((long)pdVar6 + lVar13) = uVar23;
      }
      if (bVar22) {
        uVar23 = 0x3ff0000000000000;
        if (lVar9 + -0x18 != lVar13) {
          uVar23 = 0;
        }
        *(undefined8 *)((long)pdVar6 + lVar13 + 0x18) = uVar23;
      }
      lVar21 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 2;
      auVar19._8_8_ = lVar21 + 2;
      lVar13 = lVar13 + 0x30;
    } while (lVar13 != 0x60);
    lVar11 = lVar11 + 1;
    lVar9 = lVar9 + 0x18;
    pdVar6 = pdVar6 + 1;
  } while (lVar11 != 3);
  uVar10 = 0;
  do {
    uVar14 = 0;
    do {
      local_b8._0_8_ = 1.0;
      local_b8._8_8_ = 0.0;
      local_b8._16_8_ = 0.0;
      local_b8._24_8_ = 1.0;
      uVar16 = 0;
      pVVar15 = (Vector<double,_3> *)matrix;
      do {
        if (uVar16 != uVar10) {
          uVar17 = 0;
          do {
            if (uVar14 != uVar17) {
              *(double *)
               (local_b8 +
               (long)(int)((int)uVar17 - (uint)(uVar14 < uVar17)) * 8 +
               (long)(int)((int)uVar16 - (uint)(uVar10 < uVar16)) * 0x10) =
                   ((Vector<tcu::Vector<double,_3>,_3> *)pVVar15->m_data)->m_data[0].m_data[uVar17];
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 != 3);
        }
        uVar16 = uVar16 + 1;
        pVVar15 = pVVar15 + 1;
      } while (uVar16 != 3);
      dVar18 = (double)local_b8._0_8_ * (double)local_b8._24_8_ -
               (double)local_b8._16_8_ * (double)local_b8._8_8_;
      if (((int)uVar14 + (int)uVar10 & 1U) != 0) {
        dVar18 = -dVar18;
      }
      local_68[uVar10 * 3 + uVar14] = dVar18;
      uVar14 = uVar14 + 1;
    } while (uVar14 != 3);
    uVar10 = uVar10 + 1;
  } while (uVar10 != 3);
  local_88 = (undefined1  [16])0x0;
  local_b8._32_16_ = (undefined1  [16])0x0;
  local_b8._16_8_ = 0.0;
  local_b8._24_8_ = 0.0;
  local_b8._0_8_ = 0.0;
  local_b8._8_8_ = 0.0;
  local_78 = 0.0;
  lVar9 = 0;
  lVar11 = 0;
  do {
    lVar13 = 0;
    auVar20 = _DAT_019fcc00;
    do {
      bVar22 = SUB164(auVar20 ^ _DAT_019f5ce0,4) == -0x80000000 &&
               SUB164(auVar20 ^ _DAT_019f5ce0,0) < -0x7ffffffd;
      if (bVar22) {
        uVar23 = 0x3ff0000000000000;
        if (lVar9 != lVar13) {
          uVar23 = 0;
        }
        *(undefined8 *)(puVar7 + lVar13) = uVar23;
      }
      if (bVar22) {
        uVar23 = 0x3ff0000000000000;
        if (lVar9 + -0x18 != lVar13) {
          uVar23 = 0;
        }
        *(undefined8 *)(puVar7 + lVar13 + 0x18) = uVar23;
      }
      lVar21 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 2;
      auVar20._8_8_ = lVar21 + 2;
      lVar13 = lVar13 + 0x30;
    } while (lVar13 != 0x60);
    lVar11 = lVar11 + 1;
    lVar9 = lVar9 + 0x18;
    puVar7 = puVar7 + 8;
  } while (lVar11 != 3);
  pdVar6 = local_68;
  lVar9 = 0;
  do {
    lVar11 = 0;
    pdVar12 = pdVar6;
    do {
      *(double *)(puVar8 + lVar11 * 8) = *pdVar12;
      lVar11 = lVar11 + 1;
      pdVar12 = pdVar12 + 3;
    } while (lVar11 != 3);
    lVar9 = lVar9 + 1;
    puVar8 = puVar8 + 0x18;
    pdVar6 = pdVar6 + 1;
  } while (lVar9 != 3);
  dVar18 = (matrix->m_data).m_data[1].m_data[1];
  dVar1 = (matrix->m_data).m_data[2].m_data[1];
  dVar2 = (matrix->m_data).m_data[0].m_data[1];
  dVar3 = (matrix->m_data).m_data[0].m_data[2];
  dVar4 = (matrix->m_data).m_data[1].m_data[2];
  dVar5 = (matrix->m_data).m_data[2].m_data[2];
  tcu::operator*(__return_storage_ptr__,(Matrix<double,_3,_3> *)local_b8,
                 1.0 / ((dVar2 * dVar4 - dVar18 * dVar3) * (matrix->m_data).m_data[2].m_data[0] +
                       ((dVar18 * dVar5 - dVar1 * dVar4) * (matrix->m_data).m_data[0].m_data[0] -
                       (dVar5 * dVar2 - dVar1 * dVar3) * (matrix->m_data).m_data[1].m_data[0])));
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Size, Size> inverse(const tcu::Matrix<glw::GLdouble, Size, Size>& matrix)
{
	const tcu::Matrix<glw::GLdouble, Size, Size> cof	  = cofactors(matrix);
	const tcu::Matrix<glw::GLdouble, Size, Size> adjugate = tcu::transpose(cof);
	const glw::GLdouble det		= determinant(matrix);
	const glw::GLdouble inv_det = 1.0 / det;

	tcu::Matrix<glw::GLdouble, Size, Size> result = adjugate * inv_det;

	return result;
}